

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::DirtyDefinition(Element *this,DirtyNodes dirty_nodes)

{
  byte bVar1;
  
  if (dirty_nodes != Self) {
    if (dirty_nodes == SelfAndSiblings) {
      this->field_0x17 = this->field_0x17 | 2;
      this = this->parent;
      bVar1 = 4;
      if (this != (Element *)0x0) goto LAB_00219830;
    }
    return;
  }
  bVar1 = 2;
LAB_00219830:
  this->field_0x17 = this->field_0x17 | bVar1;
  return;
}

Assistant:

void Element::DirtyDefinition(DirtyNodes dirty_nodes)
{
	switch (dirty_nodes)
	{
	case DirtyNodes::Self: dirty_definition = true; break;
	case DirtyNodes::SelfAndSiblings:
		dirty_definition = true;
		if (parent)
			parent->dirty_child_definitions = true;
		break;
	}
}